

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

void __thiscall mognetwork::TcpSocket::disconnect(TcpSocket *this)

{
  int in_ESI;
  ReadedDatas *in_RDI;
  _func_bool_vector<char,_std::allocator<char>_>_ptr *in_stack_00000048;
  ReadedDatas *in_stack_ffffffffffffffa8;
  
  Socket::close((Socket *)in_RDI,in_ESI);
  std::__cxx11::
  list<std::vector<char,std::allocator<char>>*,std::allocator<std::vector<char,std::allocator<char>>*>>
  ::remove_if<bool(*)(std::vector<char,std::allocator<char>>*)>
            ((list<std::vector<char,_std::allocator<char>_>_*,_std::allocator<std::vector<char,_std::allocator<char>_>_*>_>
              *)this,in_stack_00000048);
  ReadedDatas::ReadedDatas((ReadedDatas *)0x11db8c);
  ReadedDatas::operator=(in_RDI,in_stack_ffffffffffffffa8);
  ReadedDatas::~ReadedDatas((ReadedDatas *)0x11dbab);
  return;
}

Assistant:

void TcpSocket::disconnect()
  {
    close();
    m_pendingDatas.remove_if(deleteAll);
    m_pendingRDatas = ReadedDatas();
  }